

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O2

BigNumber * operator+(BigNumber *__return_storage_ptr__,BigNumber *nb1,uint nb2)

{
  initializer_list<unsigned_int> __l;
  allocator_type local_8d;
  uint local_8c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  BigNumber local_70;
  BigNumber local_50;
  BigNumber tmp;
  
  __l._M_len = 1;
  __l._M_array = &local_8c;
  local_8c = nb2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,__l,&local_8d);
  BigNumber::BigNumber
            (&tmp,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,nb1->m_base);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_88);
  BigNumber::BigNumber(&local_50,nb1);
  BigNumber::BigNumber(&local_70,&tmp);
  operator+(__return_storage_ptr__,&local_50,&local_70);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&tmp);
  return __return_storage_ptr__;
}

Assistant:

BigNumber operator + (BigNumber nb1, unsigned int nb2) {
    BigNumber tmp({nb2}, nb1.m_base);
    return nb1 + tmp;
}